

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_modify_passwords_file_ha1(char *fname,char *domain,char *user,char *ha1)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ushort **ppuVar7;
  size_t sVar8;
  FILE *pFVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  stat st;
  char d [256];
  char u [256];
  char h [256];
  char line [512];
  uint local_5f4;
  void *local_5f0;
  stat64 local_5c8;
  char local_538 [255];
  undefined1 local_439;
  char local_438 [255];
  undefined1 local_339;
  undefined1 local_338 [255];
  undefined1 local_239;
  char local_238 [520];
  
  memset(&local_5c8,0,0x90);
  pcVar13 = (char *)0x0;
  if ((ha1 != (char *)0x0) && (*ha1 != '\0')) {
    pcVar13 = ha1;
  }
  if (user == (char *)0x0 || (domain == (char *)0x0 || fname == (char *)0x0)) {
    return 0;
  }
  pcVar6 = strchr(user,0x3a);
  if (pcVar6 != (char *)0x0) {
    return 0;
  }
  pcVar6 = strchr(domain,0x3a);
  if (pcVar6 != (char *)0x0) {
    return 0;
  }
  uVar12 = 0;
  do {
    bVar1 = user[uVar12];
    if ((ulong)bVar1 == 0) goto LAB_001158d9;
    ppuVar7 = __ctype_b_loc();
    if (((*ppuVar7)[bVar1] & 2) != 0) {
      return 0;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xff);
  uVar12 = 0xff;
LAB_001158d9:
  if (user[uVar12 & 0xffffffff] != '\0') {
    return 0;
  }
  uVar12 = 0;
  do {
    bVar1 = domain[uVar12];
    if ((ulong)bVar1 == 0) goto LAB_00115928;
    ppuVar7 = __ctype_b_loc();
    if (((*ppuVar7)[bVar1] & 2) != 0) {
      return 0;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xff);
  uVar12 = 0xff;
LAB_00115928:
  if (domain[uVar12 & 0xffffffff] != '\0') {
    return 0;
  }
  sVar8 = strlen(fname);
  if (0xfff < sVar8) {
    return 0;
  }
  iVar5 = stat64(fname,&local_5c8);
  if (iVar5 != 0) {
    bVar4 = false;
    local_5f0 = (void *)0x0;
    local_5f4 = 0;
    goto LAB_00115b53;
  }
  if (local_5c8.st_size < 0xa00001) {
    local_5f0 = calloc((long)((int)local_5c8.st_size + 0x400),1);
    if (local_5f0 == (void *)0x0) goto LAB_00115b37;
    pFVar9 = fopen64(fname,"r");
    if (pFVar9 == (FILE *)0x0) {
      free(local_5f0);
      goto LAB_00115b42;
    }
    bVar4 = false;
    local_5f4 = 0;
    bVar2 = false;
    while ((pcVar6 = fgets(local_238,0x200,pFVar9), pcVar6 != (char *)0x0 &&
           ((int)local_5f4 < (int)local_5c8.st_size + 0x1a8))) {
      iVar5 = __isoc99_sscanf(local_238,"%255[^:]:%255[^:]:%255s",local_438,local_538,local_338);
      if (iVar5 == 3) {
        local_339 = 0;
        local_439 = 0;
        local_239 = 0;
        iVar5 = strcmp(local_438,user);
        if ((iVar5 == 0) && (iVar5 = strcmp(local_538,domain), iVar5 == 0)) {
          bVar4 = true;
          bVar3 = !bVar2;
          bVar2 = true;
          if (pcVar13 != (char *)0x0 && bVar3) {
            iVar5 = sprintf((char *)((ulong)local_5f4 + (long)local_5f0),"%s:%s:%s\n",user,domain,
                            pcVar13);
            if (iVar5 < 1) {
              fclose(pFVar9);
              free(local_5f0);
              bVar4 = false;
              bVar2 = false;
              goto LAB_00115b46;
            }
            local_5f4 = local_5f4 + iVar5;
          }
        }
        else {
          iVar5 = sprintf((char *)((ulong)local_5f4 + (long)local_5f0),"%s:%s:%s\n",local_438,
                          local_538,local_338);
          if (iVar5 < 1) {
            fclose(pFVar9);
            free(local_5f0);
            bVar2 = false;
            goto LAB_00115b46;
          }
          local_5f4 = local_5f4 + iVar5;
        }
      }
    }
    fclose(pFVar9);
    bVar2 = true;
  }
  else {
LAB_00115b37:
    local_5f0 = (void *)0x0;
LAB_00115b42:
    bVar4 = false;
    local_5f4 = 0;
    bVar2 = false;
  }
LAB_00115b46:
  if (!bVar2) {
    return 0;
  }
LAB_00115b53:
  pFVar9 = fopen64(fname,"w");
  uVar11 = 0;
  if (pFVar9 != (FILE *)0x0) {
    iVar5 = fileno(pFVar9);
    iVar5 = fchmod(iVar5,0x180);
    uVar10 = (uint)(iVar5 == 0);
    if ((local_5f0 != (void *)0x0) && (0 < (int)local_5f4)) {
      sVar8 = fwrite(local_5f0,1,(ulong)local_5f4,pFVar9);
      if (sVar8 != local_5f4) {
        uVar10 = 0;
      }
    }
    if (!bVar4 && pcVar13 != (char *)0x0) {
      iVar5 = fprintf(pFVar9,"%s:%s:%s\n",user,domain,pcVar13);
      if (iVar5 < 6) {
        uVar10 = 0;
      }
    }
    iVar5 = fclose(pFVar9);
    uVar11 = 0;
    if (iVar5 == 0) {
      uVar11 = uVar10;
    }
  }
  free(local_5f0);
  return uVar11;
}

Assistant:

CIVETWEB_API int
mg_modify_passwords_file_ha1(const char *fname,
                             const char *domain,
                             const char *user,
                             const char *ha1)
{
	int found = 0, i, result = 1;
	char line[512], u[256], d[256], h[256];
	struct stat st = {0};
	FILE *fp = NULL;
	char *temp_file = NULL;
	int temp_file_offs = 0;

	/* Regard empty password as no password - remove user record. */
	if ((ha1 != NULL) && (ha1[0] == '\0')) {
		ha1 = NULL;
	}

	/* Other arguments must not be empty */
	if ((fname == NULL) || (domain == NULL) || (user == NULL)) {
		return 0;
	}

	/* Using the given file format, user name and domain must not contain
	 * the ':' character */
	if (strchr(user, ':') != NULL) {
		return 0;
	}
	if (strchr(domain, ':') != NULL) {
		return 0;
	}

	/* Do not allow control characters like newline in user name and domain.
	 * Do not allow excessively long names either. */
	for (i = 0; ((i < 255) && (user[i] != 0)); i++) {
		if (iscntrl((unsigned char)user[i])) {
			return 0;
		}
	}
	if (user[i]) {
		return 0; /* user name too long */
	}
	for (i = 0; ((i < 255) && (domain[i] != 0)); i++) {
		if (iscntrl((unsigned char)domain[i])) {
			return 0;
		}
	}
	if (domain[i]) {
		return 0; /* domain name too long */
	}

	/* The maximum length of the path to the password file is limited */
	if (strlen(fname) >= UTF8_PATH_MAX) {
		return 0;
	}

	/* Check if the file exists, and get file size */
	if (0 == stat(fname, &st)) {
		int temp_buf_len;
		if (st.st_size > 10485760) {
			/* Some funster provided a >10 MB text file */
			return 0;
		}

		/* Add enough space for one more line */
		temp_buf_len = (int)st.st_size + 1024;

		/* Allocate memory (instead of using a temporary file) */
		temp_file = (char *)mg_calloc((size_t)temp_buf_len, 1);
		if (!temp_file) {
			/* Out of memory */
			return 0;
		}

		/* File exists. Read it into a memory buffer. */
		fp = fopen(fname, "r");
		if (fp == NULL) {
			/* Cannot read file. No permission? */
			mg_free(temp_file);
			return 0;
		}

		/* Read content and store in memory */
		while ((fgets(line, sizeof(line), fp) != NULL)
		       && ((temp_file_offs + 600) < temp_buf_len)) {
			/* file format is "user:domain:hash\n" */
			if (sscanf(line, "%255[^:]:%255[^:]:%255s", u, d, h) != 3) {
				continue;
			}
			u[255] = 0;
			d[255] = 0;
			h[255] = 0;

			if (!strcmp(u, user) && !strcmp(d, domain)) {
				/* Found the user: change the password hash or drop the user
				 */
				if ((ha1 != NULL) && (!found)) {
					i = sprintf(temp_file + temp_file_offs,
					            "%s:%s:%s\n",
					            user,
					            domain,
					            ha1);
					if (i < 1) {
						fclose(fp);
						mg_free(temp_file);
						return 0;
					}
					temp_file_offs += i;
				}
				found = 1;
			} else {
				/* Copy existing user, including password hash */
				i = sprintf(temp_file + temp_file_offs, "%s:%s:%s\n", u, d, h);
				if (i < 1) {
					fclose(fp);
					mg_free(temp_file);
					return 0;
				}
				temp_file_offs += i;
			}
		}
		fclose(fp);
	}

	/* Create new file */
	fp = fopen(fname, "w");
	if (!fp) {
		mg_free(temp_file);
		return 0;
	}

#if !defined(_WIN32)
	/* On Linux & co., restrict file read/write permissions to the owner */
	if (fchmod(fileno(fp), S_IRUSR | S_IWUSR) != 0) {
		result = 0;
	}
#endif

	if ((temp_file != NULL) && (temp_file_offs > 0)) {
		/* Store buffered content of old file */
		if (fwrite(temp_file, 1, (size_t)temp_file_offs, fp)
		    != (size_t)temp_file_offs) {
			result = 0;
		}
	}

	/* If new user, just add it */
	if ((ha1 != NULL) && (!found)) {
		if (fprintf(fp, "%s:%s:%s\n", user, domain, ha1) < 6) {
			result = 0;
		}
	}

	/* All data written */
	if (fclose(fp) != 0) {
		result = 0;
	}

	mg_free(temp_file);
	return result;
}